

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CEnvPoint,_allocator_default<CEnvPoint>_>::alloc
          (array<CEnvPoint,_allocator_default<CEnvPoint>_> *this,int new_len)

{
  CEnvPoint *pCVar1;
  undefined1 auVar2 [16];
  CEnvPoint *pCVar3;
  long lVar4;
  undefined4 *puVar5;
  ulong uVar6;
  undefined4 *puVar7;
  long lVar8;
  byte bVar9;
  
  bVar9 = 0;
  this->list_size = new_len;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_len;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x58),8) == 0) {
    uVar6 = SUB168(auVar2 * ZEXT816(0x58),0);
  }
  pCVar3 = (CEnvPoint *)operator_new__(uVar6);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  pCVar1 = this->list;
  if (new_len < 1) {
    if (pCVar1 == (CEnvPoint *)0x0) goto LAB_0014bf0b;
  }
  else {
    lVar8 = 0;
    do {
      puVar5 = (undefined4 *)((long)(pCVar1->super_CEnvPoint_v1).m_aValues + lVar8 + -8);
      puVar7 = (undefined4 *)((long)(pCVar3->super_CEnvPoint_v1).m_aValues + lVar8 + -8);
      for (lVar4 = 0x16; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar7 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      }
      lVar8 = lVar8 + 0x58;
    } while ((ulong)(uint)new_len * 0x58 - lVar8 != 0);
  }
  operator_delete__(pCVar1);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_0014bf0b:
  this->num_elements = new_len;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}